

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::PrintCommandTrace
          (cmMakefile *this,cmListFileFunction *lff,cmListFileBacktrace *bt,
          CommandMissingFromStack missing)

{
  string *filename;
  TraceFormat TVar1;
  cmake *pcVar2;
  string *psVar3;
  element_type *peVar4;
  pointer pcVar5;
  double value;
  cmListFileFunction *pcVar6;
  pointer pbVar7;
  __type _Var8;
  cmListFileContext *pcVar9;
  long lVar10;
  Value *pVVar11;
  cmGeneratedFileStream *pcVar12;
  ostream *poVar13;
  Value *root;
  string *arg_1;
  pointer pbVar14;
  char *pcVar15;
  const_iterator __begin2;
  string *filename_00;
  pointer __x;
  cmListFileArgument *arg;
  pointer pcVar16;
  string *arg_2;
  bool bVar17;
  allocator<char> local_2c1;
  cmMakefile *local_2c0;
  Value local_2b8;
  CommandMissingFromStack local_28c;
  cmListFileFunction *local_288;
  Value val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  StreamWriterBuilder builder;
  String local_208;
  string temp;
  string local_1c8;
  ostringstream msg;
  
  pcVar2 = this->GlobalGenerator->CMakeInstance;
  local_2c0 = this;
  local_28c = missing;
  local_288 = lff;
  pcVar9 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                     (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  filename = &pcVar9->FilePath;
  cmsys::SystemTools::GetFilenameName(&local_1c8,filename);
  filename_00 = (pcVar2->TraceOnlyThisSources).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (pcVar2->TraceOnlyThisSources).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (filename_00 != psVar3) {
    for (; filename_00 != psVar3; filename_00 = filename_00 + 1) {
      lVar10 = std::__cxx11::string::rfind((string *)filename,(ulong)filename_00);
      if ((lVar10 != -1) &&
         (lVar10 + filename_00->_M_string_length == (pcVar9->FilePath)._M_string_length)) {
        cmsys::SystemTools::GetFilenameName((string *)&msg,filename_00);
        _Var8 = std::operator==(&local_1c8,(string *)&msg);
        std::__cxx11::string::~string((string *)&msg);
        if (_Var8) goto LAB_001e7eb2;
      }
    }
    goto LAB_001e84a7;
  }
LAB_001e7eb2:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  pcVar6 = local_288;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  bVar17 = local_2c0->GlobalGenerator->CMakeInstance->TraceExpand;
  peVar4 = (local_288->Impl).
           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  root = (Value *)0x30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&args,((long)*(pointer *)
                          ((long)&(peVar4->Arguments).
                                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                  ._M_impl.super__Vector_impl_data + 8) -
                  (long)(peVar4->Arguments).
                        super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x30);
  peVar4 = (pcVar6->Impl).
           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar5 = *(pointer *)
            ((long)&(peVar4->Arguments).
                    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                    _M_impl.super__Vector_impl_data + 8);
  for (pcVar16 = (peVar4->Arguments).
                 super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
                 .super__Vector_impl_data._M_start; pcVar16 != pcVar5; pcVar16 = pcVar16 + 1) {
    __x = pcVar16;
    if ((bVar17 != false) && (pcVar16->Delim != Bracket)) {
      std::__cxx11::string::_M_assign((string *)&temp);
      ExpandVariablesInString(local_2c0,&temp);
      __x = (pointer)&temp;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&args,&__x->Value);
  }
  pcVar9 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                     (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  pcVar6 = local_288;
  TVar1 = local_2c0->GlobalGenerator->CMakeInstance->TraceFormatVar;
  if (TVar1 == TRACE_UNDEFINED) {
    pcVar15 = "INTERNAL ERROR: Trace format is TRACE_UNDEFINED";
LAB_001e82d0:
    std::operator<<((ostream *)&msg,pcVar15);
  }
  else {
    if (TVar1 == TRACE_HUMAN) {
      poVar13 = std::operator<<((ostream *)&msg,(string *)filename);
      poVar13 = std::operator<<(poVar13,"(");
      poVar13 = std::ostream::_M_insert<long>((long)poVar13);
      std::operator<<(poVar13,"):");
      if ((pcVar9->DeferId).
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        poVar13 = std::operator<<((ostream *)&msg,"DEFERRED:");
        poVar13 = std::operator<<(poVar13,(string *)&pcVar9->DeferId);
        std::operator<<(poVar13,":");
      }
      poVar13 = std::operator<<((ostream *)&msg,"  ");
      poVar13 = std::operator<<(poVar13,(string *)
                                        (pcVar6->Impl).
                                        super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr);
      std::operator<<(poVar13,"(");
      pbVar7 = args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pcVar15 = ")";
      for (pbVar14 = args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar7;
          pbVar14 = pbVar14 + 1) {
        poVar13 = std::operator<<((ostream *)&msg,(string *)pbVar14);
        std::operator<<(poVar13," ");
      }
      goto LAB_001e82d0;
    }
    if (TVar1 == TRACE_JSON_V1) {
      Json::Value::Value(&val,nullValue);
      Json::StreamWriterBuilder::StreamWriterBuilder(&builder);
      Json::Value::Value(&local_2b8,"");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"indentation",&local_2c1);
      pVVar11 = Json::StreamWriterBuilder::operator[](&builder,&local_208);
      Json::Value::operator=(pVVar11,&local_2b8);
      std::__cxx11::string::~string((string *)&local_208);
      Json::Value::~Value(&local_2b8);
      Json::Value::Value(&local_2b8,filename);
      pVVar11 = Json::Value::operator[](&val,"file");
      Json::Value::operator=(pVVar11,&local_2b8);
      Json::Value::~Value(&local_2b8);
      Json::Value::Value(&local_2b8,
                         ((pcVar6->Impl).
                          super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->Line);
      pVVar11 = Json::Value::operator[](&val,"line");
      Json::Value::operator=(pVVar11,&local_2b8);
      Json::Value::~Value(&local_2b8);
      peVar4 = (pcVar6->Impl).
               super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar10 = peVar4->LineEnd;
      if (peVar4->Line != lVar10) {
        Json::Value::Value(&local_2b8,lVar10);
        pVVar11 = Json::Value::operator[](&val,"line_end");
        Json::Value::operator=(pVVar11,&local_2b8);
        Json::Value::~Value(&local_2b8);
      }
      if ((pcVar9->DeferId).
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        Json::Value::Value(&local_2b8,(String *)&pcVar9->DeferId);
        pVVar11 = Json::Value::operator[](&val,"defer");
        Json::Value::operator=(pVVar11,&local_2b8);
        Json::Value::~Value(&local_2b8);
      }
      Json::Value::Value(&local_2b8,
                         &((pcVar6->Impl).
                           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->OriginalName);
      pVVar11 = Json::Value::operator[](&val,"cmd");
      Json::Value::operator=(pVVar11,&local_2b8);
      Json::Value::~Value(&local_2b8);
      Json::Value::Value(&local_2b8,arrayValue);
      pVVar11 = Json::Value::operator[](&val,"args");
      Json::Value::operator=(pVVar11,&local_2b8);
      Json::Value::~Value(&local_2b8);
      pbVar7 = args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar14 = args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar7;
          pbVar14 = pbVar14 + 1) {
        pVVar11 = Json::Value::operator[](&val,"args");
        Json::Value::Value(&local_2b8,pbVar14);
        Json::Value::append(pVVar11,&local_2b8);
        Json::Value::~Value(&local_2b8);
      }
      value = cmsys::SystemTools::GetTime();
      Json::Value::Value(&local_2b8,value);
      pVVar11 = Json::Value::operator[](&val,"time");
      Json::Value::operator=(pVVar11,&local_2b8);
      Json::Value::~Value(&local_2b8);
      bVar17 = local_28c == Yes;
      Json::Value::Value(&local_2b8,
                         ((long)(local_2c0->ExecutionStatusStack).
                                super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_2c0->ExecutionStatusStack).
                                super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) + (ulong)bVar17);
      pVVar11 = Json::Value::operator[](&val,"frame");
      Json::Value::operator=(pVVar11,&local_2b8);
      Json::Value::~Value(&local_2b8);
      Json::Value::Value(&local_2b8,(long)local_2c0->RecursionDepth + (ulong)bVar17);
      pVVar11 = Json::Value::operator[](&val,"global_frame");
      Json::Value::operator=(pVVar11,&local_2b8);
      Json::Value::~Value(&local_2b8);
      Json::writeString_abi_cxx11_((String *)&local_2b8,(Json *)&builder,(Factory *)&val,root);
      std::operator<<((ostream *)&msg,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      Json::StreamWriterBuilder::~StreamWriterBuilder(&builder);
      Json::Value::~Value(&val);
    }
  }
  pcVar12 = cmake::GetTraceFile(local_2c0->GlobalGenerator->CMakeInstance);
  if (((&(pcVar12->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)(pcVar12->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    std::__cxx11::stringbuf::str();
    poVar13 = std::operator<<((ostream *)pcVar12,(string *)&builder);
    std::operator<<(poVar13,'\n');
  }
  else {
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((string *)&builder,(char *)0x0);
  }
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::string::~string((string *)&temp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
LAB_001e84a7:
  std::__cxx11::string::~string((string *)&local_1c8);
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(cmListFileFunction const& lff,
                                   cmListFileBacktrace const& bt,
                                   CommandMissingFromStack missing) const
{
  // Check if current file in the list of requested to trace...
  std::vector<std::string> const& trace_only_this_files =
    this->GetCMakeInstance()->GetTraceSources();
  std::string const& full_path = bt.Top().FilePath;
  std::string const& only_filename = cmSystemTools::GetFilenameName(full_path);
  bool trace = trace_only_this_files.empty();
  if (!trace) {
    for (std::string const& file : trace_only_this_files) {
      std::string::size_type const pos = full_path.rfind(file);
      trace = (pos != std::string::npos) &&
        ((pos + file.size()) == full_path.size()) &&
        (only_filename == cmSystemTools::GetFilenameName(file));
      if (trace) {
        break;
      }
    }
    // Do nothing if current file wasn't requested for trace...
    if (!trace) {
      return;
    }
  }

  std::ostringstream msg;
  std::vector<std::string> args;
  std::string temp;
  bool expand = this->GetCMakeInstance()->GetTraceExpand();

  args.reserve(lff.Arguments().size());
  for (cmListFileArgument const& arg : lff.Arguments()) {
    if (expand && arg.Delim != cmListFileArgument::Bracket) {
      temp = arg.Value;
      this->ExpandVariablesInString(temp);
      args.push_back(temp);
    } else {
      args.push_back(arg.Value);
    }
  }
  cm::optional<std::string> const& deferId = bt.Top().DeferId;

  switch (this->GetCMakeInstance()->GetTraceFormat()) {
    case cmake::TraceFormat::TRACE_JSON_V1: {
#ifndef CMAKE_BOOTSTRAP
      Json::Value val;
      Json::StreamWriterBuilder builder;
      builder["indentation"] = "";
      val["file"] = full_path;
      val["line"] = static_cast<Json::Value::Int64>(lff.Line());
      if (lff.Line() != lff.LineEnd()) {
        val["line_end"] = static_cast<Json::Value::Int64>(lff.LineEnd());
      }
      if (deferId) {
        val["defer"] = *deferId;
      }
      val["cmd"] = lff.OriginalName();
      val["args"] = Json::Value(Json::arrayValue);
      for (std::string const& arg : args) {
        val["args"].append(arg);
      }
      val["time"] = cmSystemTools::GetTime();
      val["frame"] = (missing == CommandMissingFromStack::Yes ? 1 : 0) +
        static_cast<Json::Value::UInt64>(this->ExecutionStatusStack.size());
      val["global_frame"] = (missing == CommandMissingFromStack::Yes ? 1 : 0) +
        static_cast<Json::Value::UInt64>(this->RecursionDepth);
      msg << Json::writeString(builder, val);
#endif
      break;
    }
    case cmake::TraceFormat::TRACE_HUMAN:
      msg << full_path << "(" << lff.Line() << "):";
      if (deferId) {
        msg << "DEFERRED:" << *deferId << ":";
      }
      msg << "  " << lff.OriginalName() << "(";

      for (std::string const& arg : args) {
        msg << arg << " ";
      }
      msg << ")";
      break;
    case cmake::TraceFormat::TRACE_UNDEFINED:
      msg << "INTERNAL ERROR: Trace format is TRACE_UNDEFINED";
      break;
  }

  auto& f = this->GetCMakeInstance()->GetTraceFile();
  if (f) {
    f << msg.str() << '\n';
  } else {
    cmSystemTools::Message(msg.str());
  }
}